

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::unexpected::~unexpected(unexpected *this)

{
  unexpected *this_local;
  
  ~unexpected(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

unexpected( location where_, text expr_, text note_ = "" )
    : message( "failed: got unexpected exception", where_, expr_, note_) {}